

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O3

void writeDualSolution<double>
               (SoPlexBase<double> *soplex,char *filename,NameSet *colnames,NameSet *rownames,
               bool real,bool rational,bool append)

{
  Tolerances *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  void *pvVar3;
  pointer pnVar4;
  bool bVar5;
  size_t sVar6;
  ostream *poVar7;
  long lVar8;
  int iVar9;
  undefined3 in_register_00000089;
  uint uVar10;
  char *pcVar12;
  long lVar13;
  long lVar14;
  Real RVar15;
  undefined8 extraout_XMM0_Qb;
  VectorBase<double> redcost;
  VectorBase<double> dual;
  VectorRational redcost_1;
  ofstream outfile;
  undefined1 auStack_2e8 [4];
  int local_2e4;
  ulong local_2e0;
  Real local_2d8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_2d0;
  data_type local_2b8;
  undefined5 local_2a8;
  char cStack_2a3;
  char cStack_2a2;
  undefined1 uStack_2a1;
  uint local_298;
  void *local_290;
  char local_283;
  char local_282;
  double local_278;
  undefined8 uStack_270;
  NameSet *local_268;
  undefined4 local_25c;
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_258;
  NameSet *local_240;
  longlong local_238;
  long local_230;
  filebuf local_228 [8];
  double dStack_220;
  uint auStack_218 [56];
  ios_base local_138 [264];
  ulong uVar11;
  
  local_25c = CONCAT31(in_register_00000089,rational);
  pTVar1 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_268 = rownames;
  RVar15 = ::soplex::Tolerances::epsilon(pTVar1);
  local_278 = log10(RVar15);
  uStack_270 = extraout_XMM0_Qb;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)filename);
  uVar10 = (uint)-local_278;
  uVar11 = (ulong)uVar10;
  iVar9 = uVar10 + 10;
  local_240 = colnames;
  if (real) {
    ::soplex::VectorBase<double>::VectorBase
              ((VectorBase<double> *)&local_2b8.ld,
               (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
    bVar5 = ::soplex::SoPlexBase<double>::getDualFarkas(soplex,(VectorBase<double> *)&local_2b8.ld);
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\nDual ray (name, value):\n",0x19);
      local_2e4 = iVar9;
      local_2e0 = uVar11;
      if (0 < (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
        lVar8 = 0;
        do {
          local_278 = *(double *)(CONCAT44(local_2b8.la[0]._4_4_,local_2b8.ld.capacity) + lVar8 * 8)
          ;
          uStack_270 = 0;
          pTVar1 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var2 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
          }
          RVar15 = ::soplex::Tolerances::epsilon(pTVar1);
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_2d8 = RVar15;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            RVar15 = local_2d8;
          }
          if (RVar15 < ABS(local_278)) {
            if (local_268->mem == (char *)0x0) {
              std::ios::clear((int)auStack_2e8 + (int)*(undefined8 *)(local_230 + -0x18) + 0xb8);
            }
            else {
              pcVar12 = local_268->mem +
                        (local_268->set).theitem[(local_268->set).thekey[lVar8].idx].data;
              sVar6 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,pcVar12,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            *(long *)((long)&dStack_220 + *(long *)(local_230 + -0x18)) = (long)iVar9;
            *(long *)(local_228 + *(long *)(local_230 + -0x18)) = (long)(int)uVar10;
            poVar7 = std::ostream::_M_insert<double>
                               (*(double *)
                                 (CONCAT44(local_2b8.la[0]._4_4_,local_2b8.ld.capacity) + lVar8 * 8)
                               );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                         thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"All other entries are zero (within ",0x23);
      iVar9 = local_2e4;
      uVar10 = (uint)local_2e0;
      *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 1;
      *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 0x100;
      pTVar1 = (soplex->_tolerances).
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var2 = (soplex->_tolerances).
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      RVar15 = ::soplex::Tolerances::epsilon(pTVar1);
      poVar7 = std::ostream::_M_insert<double>(RVar15);
      lVar8 = *(long *)poVar7;
      *(undefined8 *)(poVar7 + *(long *)(lVar8 + -0x18) + 8) = 8;
      lVar8 = *(long *)(lVar8 + -0x18);
      *(uint *)(poVar7 + lVar8 + 0x18) = *(uint *)(poVar7 + lVar8 + 0x18) & 0xfffffefb | 4;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,").",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
    else if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0x98 & 4) != 0)) ||
             ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 4) != 0))))
            && (bVar5 = ::soplex::SoPlexBase<double>::getDual
                                  (soplex,(VectorBase<double> *)&local_2b8.ld), bVar5)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\nDual solution (name, value):\n",0x1e);
      local_2e4 = iVar9;
      local_2e0 = uVar11;
      if (0 < (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
        lVar8 = 0;
        do {
          local_278 = *(double *)(CONCAT44(local_2b8.la[0]._4_4_,local_2b8.ld.capacity) + lVar8 * 8)
          ;
          uStack_270 = 0;
          pTVar1 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var2 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
          }
          RVar15 = ::soplex::Tolerances::epsilon(pTVar1);
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_2d8 = RVar15;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            RVar15 = local_2d8;
          }
          if (RVar15 < ABS(local_278)) {
            if (local_268->mem == (char *)0x0) {
              std::ios::clear((int)auStack_2e8 + (int)*(undefined8 *)(local_230 + -0x18) + 0xb8);
            }
            else {
              pcVar12 = local_268->mem +
                        (local_268->set).theitem[(local_268->set).thekey[lVar8].idx].data;
              sVar6 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,pcVar12,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            *(long *)((long)&dStack_220 + *(long *)(local_230 + -0x18)) = (long)iVar9;
            *(long *)(local_228 + *(long *)(local_230 + -0x18)) = (long)(int)uVar10;
            poVar7 = std::ostream::_M_insert<double>
                               (*(double *)
                                 (CONCAT44(local_2b8.la[0]._4_4_,local_2b8.ld.capacity) + lVar8 * 8)
                               );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                         thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"All other dual values are zero (within ",0x27);
      iVar9 = local_2e4;
      uVar10 = (uint)local_2e0;
      *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 1;
      *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 0x100;
      pTVar1 = (soplex->_tolerances).
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var2 = (soplex->_tolerances).
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      RVar15 = ::soplex::Tolerances::epsilon(pTVar1);
      poVar7 = std::ostream::_M_insert<double>(RVar15);
      lVar8 = *(long *)poVar7;
      *(undefined8 *)(poVar7 + *(long *)(lVar8 + -0x18) + 8) = 8;
      lVar8 = *(long *)(lVar8 + -0x18);
      *(uint *)(poVar7 + lVar8 + 0x18) = *(uint *)(poVar7 + lVar8 + 0x18) & 0xfffffefb | 4;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,").",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      ::soplex::VectorBase<double>::VectorBase
                ((VectorBase<double> *)&local_2d0,
                 (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      bVar5 = ::soplex::SoPlexBase<double>::getRedCost(soplex,(VectorBase<double> *)&local_2d0);
      if (bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"\nReduced costs (name, value):\n",0x1e);
        if (0 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
          lVar14 = (long)local_2e4;
          lVar13 = (long)(int)local_2e0;
          lVar8 = 0;
          do {
            local_278 = *(double *)
                         ((long)&((local_2d0.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.
                                 num.m_backend.
                                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                 .m_data + lVar8 * 8);
            uStack_270 = 0;
            pTVar1 = (soplex->_tolerances).
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var2 = (soplex->_tolerances).
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              }
            }
            RVar15 = ::soplex::Tolerances::epsilon(pTVar1);
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              local_2d8 = RVar15;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
              RVar15 = local_2d8;
            }
            if (RVar15 < ABS(local_278)) {
              if (local_240->mem == (char *)0x0) {
                std::ios::clear((int)auStack_2e8 + (int)*(undefined8 *)(local_230 + -0x18) + 0xb8);
              }
              else {
                pcVar12 = local_240->mem +
                          (local_240->set).theitem[(local_240->set).thekey[lVar8].idx].data;
                sVar6 = strlen(pcVar12);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,pcVar12,sVar6);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
              *(long *)((long)&dStack_220 + *(long *)(local_230 + -0x18)) = lVar14;
              *(long *)(local_228 + *(long *)(local_230 + -0x18)) = lVar13;
              poVar7 = std::ostream::_M_insert<double>
                                 ((double)((local_2d0.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                          m_value.num.m_backend.
                                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                          .m_data.la[lVar8]);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set
                           .thenum);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"All other reduced costs are zero (within ",0x29);
        iVar9 = local_2e4;
        uVar10 = (uint)local_2e0;
        *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 1;
        *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
             *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 0x100;
        pTVar1 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var2 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        RVar15 = ::soplex::Tolerances::epsilon(pTVar1);
        poVar7 = std::ostream::_M_insert<double>(RVar15);
        lVar8 = *(long *)poVar7;
        *(undefined8 *)(poVar7 + *(long *)(lVar8 + -0x18) + 8) = 8;
        lVar8 = *(long *)(lVar8 + -0x18);
        *(uint *)(poVar7 + lVar8 + 0x18) = *(uint *)(poVar7 + lVar8 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,").",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
      }
      if (local_2d0.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d0.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2d0.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d0.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"No dual information available.\n",0x1f);
    }
    pvVar3 = (void *)CONCAT44(local_2b8.la[0]._4_4_,local_2b8.ld.capacity);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,CONCAT17(uStack_2a1,CONCAT16(cStack_2a2,CONCAT15(cStack_2a3,local_2a8))
                                     ) - (long)pvVar3);
    }
  }
  if ((char)local_25c != '\0') {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)&local_2d0,
                 (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
    bVar5 = ::soplex::SoPlexBase<double>::getDualFarkasRational
                      (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               *)&local_2d0);
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\nDual ray (name, value):\n",0x19);
      if (0 < (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
        local_278 = (double)(long)iVar9;
        local_2d8 = (Real)(long)(int)uVar10;
        lVar13 = 0;
        lVar8 = 0;
        do {
          pnVar4 = local_2d0.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_258.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_2b8.ld,(longlong *)&local_258,(type *)0x0);
          iVar9 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)((long)&(pnVar4->m_backend).m_value.num.m_backend.
                                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                       .m_data + lVar13),
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_2b8.ld);
          if ((local_283 == '\0') && (local_282 == '\0')) {
            operator_delete(local_290,(ulong)local_298 << 3);
          }
          if ((cStack_2a3 == '\0') && (cStack_2a2 == '\0')) {
            operator_delete(local_2b8.ld.data,(ulong)local_2b8.ld.capacity << 3);
          }
          if (iVar9 != 0) {
            if (local_268->mem == (char *)0x0) {
              std::ios::clear((int)auStack_2e8 + (int)*(undefined8 *)(local_230 + -0x18) + 0xb8);
            }
            else {
              pcVar12 = local_268->mem +
                        (local_268->set).theitem[(local_268->set).thekey[lVar8].idx].data;
              sVar6 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,pcVar12,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            *(double *)((long)&dStack_220 + *(long *)(local_230 + -0x18)) = local_278;
            *(Real *)(local_228 + *(long *)(local_230 + -0x18)) = local_2d8;
            poVar7 = boost::multiprecision::operator<<
                               ((ostream *)&local_230,
                                (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                 *)((long)&((local_2d0.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                           m_value.num.m_backend.
                                           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                           .m_data + lVar13));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          lVar8 = lVar8 + 1;
          lVar13 = lVar13 + 0x40;
        } while (lVar8 < (soplex->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                         thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"All other entries are zero.",0x1b);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
    }
    if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0x98 & 4) != 0)) ||
        ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 4) != 0)))) &&
       (bVar5 = ::soplex::SoPlexBase<double>::getDualRational
                          (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)&local_2d0), bVar5)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\nDual solution (name, value):\n",0x1e);
      if (0 < (soplex->_rationalLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .set.thenum) {
        lVar13 = 0;
        lVar8 = 0;
        do {
          pnVar4 = local_2d0.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_258.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_2b8.ld,(longlong *)&local_258,(type *)0x0);
          iVar9 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)((long)&(pnVar4->m_backend).m_value.num.m_backend.
                                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                       .m_data + lVar13),
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_2b8.ld);
          if ((local_283 == '\0') && (local_282 == '\0')) {
            operator_delete(local_290,(ulong)local_298 << 3);
          }
          if ((cStack_2a3 == '\0') && (cStack_2a2 == '\0')) {
            operator_delete(local_2b8.ld.data,(ulong)local_2b8.ld.capacity << 3);
          }
          if (iVar9 != 0) {
            if (local_268->mem == (char *)0x0) {
              std::ios::clear((int)auStack_2e8 + (int)*(undefined8 *)(local_230 + -0x18) + 0xb8);
            }
            else {
              pcVar12 = local_268->mem +
                        (local_268->set).theitem[(local_268->set).thekey[lVar8].idx].data;
              sVar6 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,pcVar12,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            poVar7 = boost::multiprecision::operator<<
                               ((ostream *)&local_230,
                                (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                 *)((long)&((local_2d0.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                           m_value.num.m_backend.
                                           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                           .m_data + lVar13));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          lVar8 = lVar8 + 1;
          lVar13 = lVar13 + 0x40;
        } while (lVar8 < (soplex->_rationalLP->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         .set.thenum);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"All other dual values are zero.",0x1f);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&local_258,
                   (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum)
      ;
      bVar5 = ::soplex::SoPlexBase<double>::getRedCostRational(soplex,(VectorRational *)&local_258);
      if (bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"\nReduced costs (name, value):\n",0x1e);
        if (0 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
          lVar8 = 0;
          lVar13 = 0;
          do {
            pnVar4 = local_258.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_238 = 0;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor<long_long>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_2b8.ld,&local_238,(type *)0x0);
            iVar9 = boost::multiprecision::backends::
                    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)((long)&(pnVar4->m_backend).m_value.num.m_backend.
                                         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                         .m_data + lVar8),
                              (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               *)&local_2b8.ld);
            if ((local_283 == '\0') && (local_282 == '\0')) {
              operator_delete(local_290,(ulong)local_298 << 3);
            }
            if ((cStack_2a3 == '\0') && (cStack_2a2 == '\0')) {
              operator_delete(local_2b8.ld.data,(ulong)local_2b8.ld.capacity << 3);
            }
            if (iVar9 != 0) {
              if (local_240->mem == (char *)0x0) {
                std::ios::clear((int)auStack_2e8 + (int)*(undefined8 *)(local_230 + -0x18) + 0xb8);
              }
              else {
                pcVar12 = local_240->mem +
                          (local_240->set).theitem[(local_240->set).thekey[lVar13].idx].data;
                sVar6 = strlen(pcVar12);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,pcVar12,sVar6);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
              poVar7 = boost::multiprecision::operator<<
                                 ((ostream *)&local_230,
                                  (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                   *)((long)&((local_258.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->m_backend
                                             ).m_value.num.m_backend.
                                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                             .m_data + lVar8));
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
            }
            lVar13 = lVar13 + 1;
            lVar8 = lVar8 + 0x40;
          } while (lVar13 < (soplex->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.
                            set.thenum);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"All other reduced costs are zero.",0x21);
        std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
        std::ostream::put((char)&local_230);
        std::ostream::flush();
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ::~vector(&local_258);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"No dual (rational) solution available.\n",0x27);
    }
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::~vector(&local_2d0);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

static
void writeDualSolution(SoPlexBase<R>& soplex, const char* filename, NameSet& colnames,
                       NameSet& rownames,
                       bool real = true, bool rational = false, bool append = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   std::ofstream outfile;

   if(append)
      outfile.open(filename, std::ios::app);
   else
      outfile.open(filename);

   if(real)
   {
      VectorBase<R> dual(soplex.numRows());

      if(soplex.getDualFarkas(dual))
      {
         outfile << "\nDual ray (name, value):\n";

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               outfile << rownames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << dual[i] << std::endl;
            }
         }

         outfile << "All other entries are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed << ")." << std::endl;
      }
      else if(soplex.isDualFeasible() && soplex.getDual(dual))
      {
         outfile << "\nDual solution (name, value):\n";

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               outfile << rownames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << dual[i] << std::endl;
            }
         }

         outfile << "All other dual values are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed << ")." << std::endl;

         VectorBase<R> redcost(soplex.numCols());

         if(soplex.getRedCost(redcost))
         {
            outfile << "\nReduced costs (name, value):\n";

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(isNotZero(redcost[i], soplex.tolerances()->epsilon()))
               {
                  outfile << colnames[i] << "\t"
                          << std::setw(printwidth) << std::setprecision(printprec)
                          << redcost[i] << std::endl;
               }
            }

            outfile << "All other reduced costs are zero (within "
                    << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                    << std::setprecision(8) << std::fixed << ")." << std::endl;
         }
      }
      else
         outfile << "No dual information available.\n";
   }

   if(rational)
   {
      VectorRational dual(soplex.numRows());

      if(soplex.getDualFarkasRational(dual))
      {
         outfile << "\nDual ray (name, value):\n";

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(dual[i] != (Rational) 0)
            {
               outfile << rownames[i] << "\t"
                       << std::setw(printwidth)
                       << std::setprecision(printprec)
                       << dual[i] << std::endl;
            }
         }

         outfile << "All other entries are zero." << std::endl;
      }

      if(soplex.isDualFeasible() && soplex.getDualRational(dual))
      {
         outfile << "\nDual solution (name, value):\n";

         for(int i = 0; i < soplex.numRowsRational(); ++i)
         {
            if(dual[i] != (Rational) 0)
               outfile << rownames[i] << "\t" << dual[i] << std::endl;
         }

         outfile << "All other dual values are zero." << std::endl;

         VectorRational redcost(soplex.numCols());

         if(soplex.getRedCostRational(redcost))
         {
            outfile << "\nReduced costs (name, value):\n";

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(redcost[i] != (Rational) 0)
                  outfile << colnames[i] << "\t" << redcost[i] << std::endl;
            }

            outfile << "All other reduced costs are zero." << std::endl;
         }
      }
      else
         outfile << "No dual (rational) solution available.\n";
   }
}